

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::extendF32<(wasm::LaneOrder)0>(Literal *__return_storage_ptr__,Literal *vec)

{
  reference this;
  reference this_00;
  float fVar1;
  Literal local_e0;
  size_t local_c8;
  size_t idx;
  size_t i;
  undefined1 local_a8 [8];
  LaneArray<2> result;
  LaneArray<4> lanes;
  Literal *vec_local;
  
  Literal::getLanesF32x4((LaneArray<4> *)&result._M_elems[1].type,vec);
  std::array<wasm::Literal,_2UL>::array((array<wasm::Literal,_2UL> *)local_a8);
  for (idx = 0; idx < 2; idx = idx + 1) {
    local_c8 = idx;
    this = std::array<wasm::Literal,_4UL>::operator[]
                     ((array<wasm::Literal,_4UL> *)&result._M_elems[1].type,idx);
    fVar1 = Literal::getf32(this);
    Literal::Literal(&local_e0,(double)fVar1);
    this_00 = std::array<wasm::Literal,_2UL>::operator[]((array<wasm::Literal,_2UL> *)local_a8,idx);
    Literal::operator=(this_00,&local_e0);
    Literal::~Literal(&local_e0);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)local_a8);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_a8);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&result._M_elems[1].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extendF32(const Literal& vec) {
  LaneArray<4> lanes = vec.getLanesF32x4();
  LaneArray<2> result;
  for (size_t i = 0; i < 2; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + 2;
    result[i] = Literal((double)lanes[idx].getf32());
  }
  return Literal(result);
}